

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O1

void testScanLineApi(string *tempDir)

{
  double dVar1;
  undefined1 uVar2;
  char cVar3;
  ushort uVar4;
  int iVar5;
  uint *puVar6;
  half *phVar7;
  float *pfVar8;
  long *plVar9;
  long lVar10;
  float fVar11;
  uint uVar12;
  int lorder;
  ulong uVar13;
  uint *puVar14;
  int rmode;
  int H;
  half *phVar15;
  long lVar16;
  double dVar17;
  undefined8 uVar18;
  double dVar19;
  float *pfVar20;
  Array2D<Imath_3_2::half> ph;
  Array2D<unsigned_int> pi;
  Array2D<float> pf;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the scanline API for tiled files",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  pi._sizeX = 0x51;
  pi._sizeY = 0x30;
  puVar6 = (uint *)operator_new__(0x3cc0);
  ph._sizeX = 0x51;
  ph._sizeY = 0x30;
  pi._data = puVar6;
  phVar7 = (half *)operator_new__(0x1e60);
  pf._sizeX = 0x51;
  pf._sizeY = 0x30;
  ph._data = phVar7;
  pfVar8 = (float *)operator_new__(0x3cc0);
  iVar5 = 0;
  lVar10 = 0;
  puVar14 = puVar6;
  phVar15 = phVar7;
  pfVar20 = pfVar8;
  pf._data = pfVar8;
  do {
    lVar16 = -0x30;
    do {
      puVar14[lVar16 + 0x30] = (int)lVar16 + iVar5 + 0x30;
      dVar19 = (double)((int)lVar16 + 0x30);
      dVar17 = sin(dVar19);
      dVar1 = sin((double)(int)lVar10 * 0.5);
      fVar11 = ABS((float)(dVar1 + dVar17));
      uVar4 = (ushort)((uint)(float)(dVar1 + dVar17) >> 0x10) & 0x8000;
      if ((uint)fVar11 < 0x38800000) {
        if ((0x33000000 < (uint)fVar11) &&
           (uVar12 = (uint)fVar11 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar11 >> 0x17),
           uVar4 = uVar4 | (ushort)(uVar12 >> (0x7eU - cVar3 & 0x1f)),
           0x80000000 < uVar12 << (cVar3 + 0xa2U & 0x1f))) {
          uVar4 = uVar4 + 1;
        }
      }
      else if ((uint)fVar11 < 0x7f800000) {
        if ((uint)fVar11 < 0x477ff000) {
          uVar4 = (ushort)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd)
                  | uVar4;
        }
        else {
          uVar4 = uVar4 | 0x7c00;
        }
      }
      else {
        uVar4 = uVar4 | 0x7c00;
        if (fVar11 != INFINITY) {
          uVar12 = (uint)fVar11 >> 0xd & 0x3ff;
          uVar4 = uVar4 | (ushort)uVar12 | (ushort)(uVar12 == 0);
        }
      }
      phVar15[lVar16 + 0x30]._h = uVar4;
      dVar17 = sin((double)(int)lVar10);
      dVar19 = sin(dVar19 * 0.5);
      pfVar8[lVar16 + 0x30] = (float)(dVar19 + dVar17);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0);
    lVar10 = lVar10 + 1;
    pfVar8 = pfVar8 + 0x30;
    phVar15 = phVar15 + 0x30;
    puVar14 = puVar14 + 0x30;
    iVar5 = iVar5 + 100;
  } while (lVar10 != 0x51);
  uVar2 = IlmThread_3_4::supportsThreads();
  uVar18 = CONCAT71((int7)((ulong)dVar17 >> 8),uVar2);
  uVar13 = 0;
  do {
    cVar3 = IlmThread_3_4::supportsThreads();
    if (cVar3 != '\0') {
      Imf_3_4::setGlobalThreadCount((int)uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar5 = Imf_3_4::globalThreadCount();
      plVar9 = (long *)std::ostream::operator<<(&std::cout,iVar5);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
    }
    iVar5 = 0;
    do {
      H = 0;
      do {
        anon_unknown.dwarf_2f31a9::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,INCREASING_Y,NO_COMPRESSION,ROUND_UP,1,(int)uVar18,
                   (int)uVar13,(int)pfVar20);
        anon_unknown.dwarf_2f31a9::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,0xffffffef,0xffffffe3,ROUND_UP,1,(int)uVar18,
                   (int)uVar13,(int)pfVar20);
        anon_unknown.dwarf_2f31a9::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,INCREASING_Y,NO_COMPRESSION,0x18,0x1a,(int)uVar18,
                   (int)uVar13,(int)pfVar20);
        anon_unknown.dwarf_2f31a9::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,0xffffffef,0xffffffe3,0x18,0x1a,(int)uVar18,
                   (int)uVar13,(int)pfVar20);
        anon_unknown.dwarf_2f31a9::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,INCREASING_Y,NO_COMPRESSION,0x30,0x51,(int)uVar18,
                   (int)uVar13,(int)pfVar20);
        anon_unknown.dwarf_2f31a9::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,0xffffffef,0xffffffe3,0x30,0x51,(int)uVar18,
                   (int)uVar13,(int)pfVar20);
        anon_unknown.dwarf_2f31a9::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,INCREASING_Y,NO_COMPRESSION,0x80,0x60,(int)uVar18,
                   (int)uVar13,(int)pfVar20);
        anon_unknown.dwarf_2f31a9::writeRead
                  (tempDir,&pi,&ph,&pf,iVar5,H,0xffffffef,0xffffffe3,0x80,0x60,(int)uVar18,
                   (int)uVar13,(int)pfVar20);
        H = H + 1;
      } while (H == 1);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    uVar12 = (uint)uVar13;
    uVar13 = (ulong)(uVar12 + 1);
  } while (((byte)uVar18 & uVar12 < 3) != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  operator_delete__(pfVar20);
  operator_delete__(phVar7);
  operator_delete__(puVar6);
  return;
}

Assistant:

void
testScanLineApi (const std::string& tempDir)
{
    try
    {
        cout << "Testing the scanline API for tiled files" << endl;

        const int W  = 48;
        const int H  = 81;
        const int DX = -17;
        const int DY = -29;

        Array2D<unsigned int> pi (H, W);
        Array2D<half>         ph (H, W);
        Array2D<float>        pf (H, W);
        fillPixels (pi, ph, pf, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            for (int lorder = 0; lorder < NUM_LINEORDERS; ++lorder)
            {
                for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
                {
                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        1,
                        1);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        1,
                        1);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        24,
                        26);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        24,
                        26);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        48,
                        81);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        48,
                        81);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        128,
                        96);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        128,
                        96);
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}